

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cmd.cpp
# Opt level: O0

void FS_EmulateCmd(char *string)

{
  FRenderer *pFVar1;
  undefined8 buffer;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_130;
  int local_12c;
  int iStack_128;
  int i;
  double playerviewheight;
  undefined1 local_110 [8];
  FScanner sc;
  char *string_local;
  
  sc._248_8_ = string;
  FScanner::FScanner((FScanner *)local_110);
  buffer = sc._248_8_;
  sVar5 = strlen((char *)sc._248_8_);
  FScanner::OpenMem((FScanner *)local_110,"RUNCMD",(char *)buffer,(int)sVar5);
LAB_008fff12:
  do {
    while( true ) {
      bVar2 = FScanner::GetString((FScanner *)local_110);
      if (!bVar2) {
        FScanner::~FScanner((FScanner *)local_110);
        return;
      }
      bVar2 = FScanner::Compare((FScanner *)local_110,"GIMME");
      if (!bVar2) break;
      while ((bVar2 = FScanner::GetString((FScanner *)local_110), bVar2 &&
             (bVar2 = FScanner::Compare((FScanner *)local_110,";"), !bVar2))) {
        FS_Gimme((char *)local_110);
      }
    }
    bVar2 = FScanner::Compare((FScanner *)local_110,"ALLOWJUMP");
    if (!bVar2) {
      bVar2 = FScanner::Compare((FScanner *)local_110,"gravity");
      if (bVar2) {
        FScanner::MustGetFloat((FScanner *)local_110);
        level.gravity = (double)(float)((double)sc._16_8_ * 800.0);
        do {
          bVar2 = FScanner::GetString((FScanner *)local_110);
          if (!bVar2) break;
          bVar2 = FScanner::Compare((FScanner *)local_110,";");
        } while (!bVar2);
      }
      else {
        bVar2 = FScanner::Compare((FScanner *)local_110,"viewheight");
        if (bVar2) {
          FScanner::MustGetFloat((FScanner *)local_110);
          iStack_128 = sc.Number;
          i = sc._20_4_;
          for (local_12c = 0; local_12c < 8; local_12c = local_12c + 1) {
            if ((&players)[(long)local_12c * 0x54] != 0) {
              *(undefined8 *)((&players)[(long)local_12c * 0x54] + 0x4e0) = _iStack_128;
            }
            *(undefined8 *)(&DAT_00d634c8 + (long)local_12c * 0x2a0) = _iStack_128;
            player_t::Uncrouch((player_t *)(&players + (long)local_12c * 0x54));
          }
          do {
            bVar2 = FScanner::GetString((FScanner *)local_110);
            if (!bVar2) break;
            bVar2 = FScanner::Compare((FScanner *)local_110,";");
          } while (!bVar2);
        }
        else {
          bVar2 = FScanner::Compare((FScanner *)local_110,"map");
          if (bVar2) {
            FS_MapCmd((FScanner *)local_110);
          }
          else {
            bVar2 = FScanner::Compare((FScanner *)local_110,"gr_fogdensity");
            if (bVar2) {
              FScanner::MustGetNumber((FScanner *)local_110);
              pFVar1 = Renderer;
              iVar4 = sc.StringLen * 0x46;
              PalEntry::PalEntry((PalEntry *)&local_130.field_0,0xff000000);
              (*pFVar1->_vptr_FRenderer[0x15])
                        (pFVar1,(ulong)(uint)(iVar4 / 400),(ulong)local_130.d,0);
            }
            else {
              bVar2 = FScanner::Compare((FScanner *)local_110,"gr_fogcolor");
              if (bVar2) {
                FScanner::MustGetString((FScanner *)local_110);
                lVar6 = strtol((char *)local_110,(char **)0x0,0x10);
                level.fadeto = (DWORD)lVar6;
              }
              else {
                do {
                  bVar2 = FScanner::GetString((FScanner *)local_110);
                  if (!bVar2) break;
                  bVar2 = FScanner::Compare((FScanner *)local_110,";");
                } while (!bVar2);
              }
            }
          }
        }
      }
      goto LAB_008fff12;
    }
    FScanner::MustGetNumber((FScanner *)local_110);
    if (sc.StringLen == 0) {
      uVar3 = FIntCVar::operator_cast_to_int(&dmflags);
      FIntCVar::operator=(&dmflags,uVar3 | 0x10000);
    }
    else {
      uVar3 = FIntCVar::operator_cast_to_int(&dmflags);
      FIntCVar::operator=(&dmflags,uVar3 & 0xfffeffff);
    }
    do {
      bVar2 = FScanner::GetString((FScanner *)local_110);
      if (!bVar2) break;
      bVar2 = FScanner::Compare((FScanner *)local_110,";");
    } while (!bVar2);
  } while( true );
}

Assistant:

void FS_EmulateCmd(char * string)
{
	FScanner sc;
	sc.OpenMem("RUNCMD", string, (int)strlen(string));
	while (sc.GetString())
	{
		if (sc.Compare("GIMME"))
		{
			while (sc.GetString())
			{
				if (!sc.Compare(";")) FS_Gimme(sc.String);
				else break;
			}
		}
		else if (sc.Compare("ALLOWJUMP"))
		{
			sc.MustGetNumber();
			if (sc.Number) dmflags = dmflags & ~DF_NO_JUMP;
			else dmflags=dmflags | DF_NO_JUMP;
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
		else if (sc.Compare("gravity"))
		{
			sc.MustGetFloat();
			level.gravity=(float)(sc.Float*800);
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
		else if (sc.Compare("viewheight"))
		{
			sc.MustGetFloat();
			double playerviewheight = sc.Float;
			for(int i=0;i<MAXPLAYERS;i++)
			{
				// No, this is not correct. But this is the way Legacy WADs expect it to be handled!
				if (players[i].mo != NULL) players[i].mo->ViewHeight = playerviewheight;
				players[i].viewheight = playerviewheight;
				players[i].Uncrouch();
			}
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
		else if (sc.Compare("map"))
		{
			FS_MapCmd(sc);
		}
		else if (sc.Compare("gr_fogdensity"))
		{
			sc.MustGetNumber();
			// Using this disables most MAPINFO fog options!
			Renderer->SetFogParams(sc.Number*70/400, 0xff000000, 0, 0);
		}
		else if (sc.Compare("gr_fogcolor"))
		{
			sc.MustGetString();
			level.fadeto = strtol(sc.String, NULL, 16);
		}

		else
		{
			// Skip unhandled commands
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
	}
}